

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

APInt * __thiscall llvm::APInt::operator=(APInt *this,APInt *RHS)

{
  bool bVar1;
  APInt *RHS_local;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if ((bVar1) && (bVar1 = isSingleWord(RHS), bVar1)) {
    this->U = RHS->U;
    this->BitWidth = RHS->BitWidth;
    this_local = clearUnusedBits(this);
  }
  else {
    AssignSlowCase(this,RHS);
    this_local = this;
  }
  return this_local;
}

Assistant:

APInt &operator=(const APInt &RHS) {
    // If the bitwidths are the same, we can avoid mucking with memory
    if (isSingleWord() && RHS.isSingleWord()) {
      U.VAL = RHS.U.VAL;
      BitWidth = RHS.BitWidth;
      return clearUnusedBits();
    }

    AssignSlowCase(RHS);
    return *this;
  }